

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O0

void __thiscall level_tools::split_lod_textures(level_tools *this)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  xr_image *this_00;
  xr_image *this_01;
  xr_file_system *this_02;
  reference pcVar7;
  char *pcVar8;
  reference ppxVar9;
  ogf4_lod_face *poVar10;
  undefined8 extraout_XMM0_Qa;
  undefined8 uVar11;
  undefined8 extraout_XMM0_Qa_00;
  double dVar12;
  char local_14c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  irect rect;
  uint_fast32_t j;
  ogf4_lod_vertex *vert;
  uint_fast32_t i;
  ogf4_lod_face *lod_faces;
  frect uvs;
  xr_ogf_vec_cit end_1;
  xr_ogf_vec_cit it_1;
  xr_name_gen reference;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_80;
  int c;
  iterator end;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  iterator it;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string path;
  uint h;
  uint w;
  xr_file_system *fs;
  xr_image *lods_nm;
  xr_image *lods;
  level_tools *this_local;
  
  bVar4 = std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::empty
                    (&this->m_mu_models);
  if (!bVar4) {
    this_00 = xray_re::xr_level::lods(this->m_level);
    this_01 = xray_re::xr_level::lods_nm(this->m_level);
    if ((this_00 != (xr_image *)0x0) && (this_01 != (xr_image *)0x0)) {
      xray_re::msg("splitting %s/%s","level_lods.dds","level_lods_nm.dds");
      this_02 = xray_re::xr_file_system::instance();
      bVar4 = xray_re::xr_file_system::folder_exist(this_02,"$game_textures$","lod");
      if (!bVar4) {
        xray_re::xr_file_system::create_folder(this_02,"$game_textures$","lod");
      }
      path.field_2._12_4_ = xray_re::xr_image::width(this_00);
      path.field_2._8_4_ = xray_re::xr_image::height(this_00);
      uVar3 = path.field_2._12_4_;
      uVar5 = xray_re::xr_image::width(this_01);
      uVar2 = path.field_2._8_4_;
      bVar4 = false;
      if (uVar3 == uVar5) {
        uVar5 = xray_re::xr_image::height(this_01);
        bVar4 = uVar2 == uVar5;
      }
      if (!bVar4) {
        __assert_fail("w == lods_nm->width() && h == lods_nm->height()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                      ,0x23c,"void level_tools::split_lod_textures() const");
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"lod\\lod_",&local_51);
      std::allocator<char>::~allocator(&local_51);
      std::__cxx11::string::operator+=((string *)local_50,(string *)&this->m_objects_ref);
      std::__cxx11::string::operator+=((string *)local_50,"lod");
      end._M_current = (char *)std::__cxx11::string::begin();
      local_70 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&end,8);
      _Stack_80._M_current = (char *)std::__cxx11::string::end();
      while (bVar4 = __gnu_cxx::operator!=(&local_70,&stack0xffffffffffffff80), bVar4) {
        pcVar7 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_70);
        if (*pcVar7 == 0x5c) {
          local_14c = '_';
        }
        else {
          iVar6 = tolower((int)*pcVar7);
          local_14c = (char)iVar6;
        }
        pcVar7 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_70);
        *pcVar7 = local_14c;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_70);
      }
      pcVar8 = (char *)std::__cxx11::string::c_str();
      xray_re::xr_name_gen::xr_name_gen((xr_name_gen *)&it_1,pcVar8,false);
      end_1._M_current =
           (xr_ogf **)
           std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::begin
                     (&this->m_mu_models);
      uvs.field_0.field_0.rb.field_0 =
           (_vector2<float>)
           std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::end
                     (&this->m_mu_models);
      while (bVar4 = __gnu_cxx::operator!=
                               (&end_1,(__normal_iterator<xray_re::xr_ogf_*const_*,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
                                        *)&uvs.field_0.field_0.rb), bVar4) {
        xray_re::_rect<float>::invalidate((_rect<float> *)&lod_faces);
        ppxVar9 = __gnu_cxx::
                  __normal_iterator<xray_re::xr_ogf_*const_*,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
                  ::operator*(&end_1);
        poVar10 = xray_re::xr_ogf::lod_faces(*ppxVar9);
        vert = (ogf4_lod_vertex *)0x8;
        uVar11 = extraout_XMM0_Qa;
        while (vert != (ogf4_lod_vertex *)0x0) {
          vert = (ogf4_lod_vertex *)(vert[-1].pad + 2);
          rect.field_0.field_0.rb.field_0 =
               (_vector2<int>)(anon_union_8_3_f28016de_for__vector2<int>_1)0x4;
          while ((anon_union_8_3_f28016de_for__vector2<int>_1)rect.field_0.field_0.rb.field_0 !=
                 (anon_union_8_3_f28016de_for__vector2<int>_1)0x0) {
            lVar1 = (long)rect.field_0.field_0.rb.field_0 + -1;
            rect.field_0.field_0.rb.field_0 =
                 (_vector2<int>)((long)rect.field_0.field_0.rb.field_0 + -1);
            xray_re::_rect<float>::extend
                      ((_rect<float> *)&lod_faces,&poVar10[(long)vert].v[lVar1].t);
            uVar11 = extraout_XMM0_Qa_00;
          }
        }
        dVar12 = std::floor((double)CONCAT44((int)((ulong)uVar11 >> 0x20),
                                             (float)(uint)path.field_2._12_4_ * lod_faces._0_4_));
        local_e8._0_4_ = (undefined4)SUB84(dVar12,0);
        dVar12 = std::floor((double)(ulong)(uint)((float)(uint)path.field_2._8_4_ * lod_faces._4_4_)
                           );
        local_e8._4_4_ = (undefined4)SUB84(dVar12,0);
        dVar12 = std::floor((double)(ulong)(uint)((float)(uint)path.field_2._12_4_ *
                                                 uvs.field_0.field_1.x1));
        rect.field_0.field_1.x1 = (int)SUB84(dVar12,0);
        dVar12 = std::floor((double)(ulong)(uint)((float)(uint)path.field_2._8_4_ *
                                                 uvs.field_0.field_1.y1));
        rect.field_0.field_1.y1 = (int)SUB84(dVar12,0);
        bVar4 = is_power_of_two((rect.field_0.field_1.x1 - local_e8._0_4_) + 1);
        if (!bVar4) {
          __assert_fail("is_power_of_two(rect.x2 - rect.x1 + 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                        ,0x255,"void level_tools::split_lod_textures() const");
        }
        bVar4 = is_power_of_two((rect.field_0.field_1.y1 - local_e8._4_4_) + 1);
        if (!bVar4) {
          __assert_fail("is_power_of_two(rect.y2 - rect.y1 + 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                        ,0x256,"void level_tools::split_lod_textures() const");
        }
        pcVar8 = xray_re::xr_name_gen::get((xr_name_gen *)&it_1);
        std::__cxx11::string::operator=((string *)local_50,pcVar8);
        std::operator+(&local_108,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,".dds");
        xray_re::xr_image::save_dds(this_00,"$game_textures$",&local_108,(irect *)local_e8);
        std::__cxx11::string::~string((string *)&local_108);
        std::operator+(&local_128,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,"_nm.dds");
        xray_re::xr_image::save_dds(this_01,"$game_textures$",&local_128,(irect *)local_e8);
        std::__cxx11::string::~string((string *)&local_128);
        __gnu_cxx::
        __normal_iterator<xray_re::xr_ogf_*const_*,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
        ::operator++(&end_1);
        xray_re::xr_name_gen::next((xr_name_gen *)&it_1);
      }
      xray_re::xr_level::clear_lods(this->m_level);
      xray_re::xr_level::clear_lods_nm(this->m_level);
      xray_re::xr_name_gen::~xr_name_gen((xr_name_gen *)&it_1);
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  return;
}

Assistant:

void level_tools::split_lod_textures() const
{
	if (m_mu_models.empty())
		return;
	const xr_image* lods = m_level->lods();
	const xr_image* lods_nm = m_level->lods_nm();
	if (lods == 0 || lods_nm == 0)
		return;
	msg("splitting %s/%s", "level_lods.dds", "level_lods_nm.dds");
	xr_file_system& fs = xr_file_system::instance();
	if (!fs.folder_exist(PA_GAME_TEXTURES, "lod"))
		fs.create_folder(PA_GAME_TEXTURES, "lod");
	unsigned w = lods->width(), h = lods->height();
	xr_assert(w == lods_nm->width() && h == lods_nm->height());
	std::string path("lod\\lod_");
	path += m_objects_ref;
	path += "lod";
	for (std::string::iterator it = path.begin() + 8, end = path.end(); it != end; ++it) {
		int c = *it;
		*it = (c == '\\') ? '_' : std::tolower(c);
	}
	xr_name_gen reference(path.c_str(), false);
	for (xr_ogf_vec_cit it = m_mu_models.begin(), end = m_mu_models.end();
			it != end; ++it, reference.next()) {
		frect uvs;
		uvs.invalidate();
		const ogf4_lod_face* lod_faces = (*it)->lod_faces();
		for (uint_fast32_t i = 8; i != 0;) {
			const ogf4_lod_vertex* vert = lod_faces[--i].v;
			for (uint_fast32_t j = 4; j != 0;)
				uvs.extend(vert[--j].t);
		}

		irect rect;
		rect.x1 = int(std::floor(w*uvs.x1));
		rect.y1 = int(std::floor(h*uvs.y1));
		rect.x2 = int(std::floor(w*uvs.x2));
		rect.y2 = int(std::floor(h*uvs.y2));
		xr_assert(is_power_of_two(rect.x2 - rect.x1 + 1));
		xr_assert(is_power_of_two(rect.y2 - rect.y1 + 1));

		path = reference.get();
		lods->save_dds(PA_GAME_TEXTURES, path + ".dds", &rect);
		lods_nm->save_dds(PA_GAME_TEXTURES, path + "_nm.dds", &rect);
	}
	m_level->clear_lods();
	m_level->clear_lods_nm();
}